

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# objectmodelbuilder.h
# Opt level: O0

bool __thiscall
ObjectModelBuilder::buildMaybeResource(ObjectModelBuilder *this,value *value,Class *clazz)

{
  bool bVar1;
  ostream *poVar2;
  string *resourceString;
  Class *clazz_local;
  value *value_local;
  ObjectModelBuilder *this_local;
  
  bVar1 = picojson::value::is<std::__cxx11::string>(value);
  if (bVar1) {
    resourceString = picojson::value::get<std::__cxx11::string>(value);
    this_local._7_1_ = buildResource(this,resourceString,clazz);
  }
  else {
    poVar2 = std::operator<<((ostream *)&std::cerr,"error: resource in class=\'");
    poVar2 = std::operator<<(poVar2,(string *)clazz);
    poVar2 = std::operator<<(poVar2,"\' is not a JSON string..");
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool ObjectModelBuilder::buildMaybeResource(const picojson::value &value, Class *clazz)
{
    if (!value.is<std::string>()) {
        std::cerr << "error: resource in class='" << clazz->name << "' is not a JSON string.." << std::endl;
        return false;
    }
    return buildResource(value.get<std::string>(), clazz);
}